

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Performance::ShaderControlStatementTests::init
          (ShaderControlStatementTests *this,EVP_PKEY_CTX *ctx)

{
  LoopType LVar1;
  TestContext *pTVar2;
  RenderContext *pRVar3;
  Context *pCVar4;
  int extraout_EAX;
  TestNode *pTVar5;
  ShaderPerformanceCaseGroup *pSVar6;
  long *plVar7;
  ShaderPerformanceCase *pSVar8;
  TestNode *node;
  long *plVar9;
  PerfCaseType caseType;
  TestNode *pTVar10;
  int iVar11;
  undefined8 unaff_RBP;
  ulong uVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  bool bVar16;
  string caseName;
  long *local_100;
  long local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  ShaderPerformanceCaseGroup *local_c0;
  anon_struct_24_3_4a1fe5f2 *local_b8;
  TestNode *local_b0;
  TestNode *local_a8;
  TestNode *local_a0;
  char *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"if_else",
             "if-else Conditional Performance Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  local_b8 = (anon_struct_24_3_4a1fe5f2 *)0x0;
  uVar12 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  local_b0 = (TestNode *)this;
  local_a8 = pTVar5;
  do {
    pTVar10 = local_a8;
    pTVar5 = local_b0;
    pSVar6 = (ShaderPerformanceCaseGroup *)operator_new(0x80);
    pcVar15 = "Vertex and fragment";
    if ((char)uVar12 != '\0') {
      pcVar15 = "Unexpected vertex";
    }
    deqp::gls::ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup
              (pSVar6,pTVar5->m_testCtx,pcVar15 + 0xb,::glcts::fixed_sample_locations_values + 1);
    local_c0 = pSVar6;
    tcu::TestNode::addChild(pTVar10,(TestNode *)pSVar6);
    local_a0 = (TestNode *)CONCAT44(local_a0._4_4_,(int)uVar12);
    local_98 = "varying";
    if ((char)uVar12 != '\0') {
      local_98 = "attribute";
    }
    iVar13 = 0;
    do {
      iVar11 = 0;
      do {
        iVar14 = 0;
        do {
          if (iVar13 != 2 && iVar14 == 2) break;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,0x1af8059,0x1af8059);
          plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
          local_90 = &local_80;
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            local_80 = *plVar9;
            lStack_78 = plVar7[3];
          }
          else {
            local_80 = *plVar9;
            local_90 = (long *)*plVar7;
          }
          local_88 = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_70 = &local_60;
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            local_60 = *plVar9;
            lStack_58 = plVar7[3];
          }
          else {
            local_60 = *plVar9;
            local_70 = (long *)*plVar7;
          }
          local_68 = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_e0 = &local_d0;
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            local_d0 = *plVar9;
            lStack_c8 = plVar7[3];
          }
          else {
            local_d0 = *plVar9;
            local_e0 = (long *)*plVar7;
          }
          local_d8 = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
          local_100 = &local_f0;
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            local_f0 = *plVar9;
            lStack_e8 = plVar7[3];
          }
          else {
            local_f0 = *plVar9;
            local_100 = (long *)*plVar7;
          }
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if (local_e0 != &local_d0) {
            operator_delete(local_e0,local_d0 + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          pSVar8 = (ShaderPerformanceCase *)operator_new(0x1f0);
          deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                    (pSVar8,((Context *)local_b0[1]._vptr_TestNode)->m_testCtx,
                     ((Context *)local_b0[1]._vptr_TestNode)->m_renderCtx,(char *)local_100,
                     ::glcts::fixed_sample_locations_values + 1,(PerfCaseType)local_b8);
          (pSVar8->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__ConditionalCase_02134640;
          *(int *)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode = iVar13;
          *(int *)((long)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar14;
          *(int *)&pSVar8[1].super_TestCase.super_TestNode.m_testCtx = iVar11;
          pSVar8[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
          pSVar8[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
          *(undefined8 *)
           ((long)&pSVar8[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) = 0;
          *(undefined8 *)((long)&pSVar8[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0;
          deqp::gls::ShaderPerformanceCaseGroup::addChild(local_c0,pSVar8);
          if (local_100 != &local_f0) {
            operator_delete(local_100,local_f0 + 1);
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 != 3);
        iVar11 = iVar11 + 1;
      } while (iVar11 != 3);
      iVar13 = iVar13 + 1;
    } while (iVar13 != 3);
    pSVar8 = (ShaderPerformanceCase *)operator_new(0x1c8);
    pTVar5 = local_a0;
    pTVar2 = ((Context *)local_b0[1]._vptr_TestNode)->m_testCtx;
    pRVar3 = ((Context *)local_b0[1]._vptr_TestNode)->m_renderCtx;
    bVar16 = ((ulong)local_a0 & 1) == 0;
    if (bVar16) {
      deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                (pSVar8,pTVar2,pRVar3,"reference_unmixed",::glcts::fixed_sample_locations_values + 1
                 ,CASETYPE_FRAGMENT);
      pSVar6 = local_c0;
      (pSVar8->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderPerformanceCase_02134870;
      *(undefined1 *)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
      deqp::gls::ShaderPerformanceCaseGroup::addChild(local_c0,pSVar8);
      pSVar8 = (ShaderPerformanceCase *)operator_new(0x1c8);
      deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                (pSVar8,((Context *)local_b0[1]._vptr_TestNode)->m_testCtx,
                 ((Context *)local_b0[1]._vptr_TestNode)->m_renderCtx,"reference_mixed",
                 ::glcts::fixed_sample_locations_values + 1,CASETYPE_FRAGMENT);
    }
    else {
      deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
                (pSVar8,pTVar2,pRVar3,"reference",::glcts::fixed_sample_locations_values + 1,
                 CASETYPE_VERTEX);
      pSVar6 = local_c0;
    }
    (pSVar8->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderPerformanceCase_02134870;
    *(bool *)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode = !bVar16;
    deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar6,pSVar8);
    pSVar8 = (ShaderPerformanceCase *)operator_new(0x1c0);
    deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
              (pSVar8,((Context *)local_b0[1]._vptr_TestNode)->m_testCtx,
               ((Context *)local_b0[1]._vptr_TestNode)->m_renderCtx,"reference_empty",
               ::glcts::fixed_sample_locations_values + 1,(PerfCaseType)local_b8);
    (pSVar8->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderPerformanceCase_02134910;
    deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar6,pSVar8);
    local_b8 = (anon_struct_24_3_4a1fe5f2 *)&DAT_00000001;
    uVar12 = 0;
  } while (((ulong)pTVar5 & 1) != 0);
  pTVar10 = (TestNode *)0x0;
  pTVar5 = local_b0;
LAB_00ff33cd:
  node = (TestNode *)operator_new(0x70);
  local_a8 = pTVar10;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pTVar5->m_testCtx,init::loopGroups[(long)pTVar10].name,
             init::loopGroups[(long)pTVar10].description);
  local_b8 = init::loopGroups + (long)pTVar10;
  tcu::TestNode::addChild(pTVar5,node);
  caseType = CASETYPE_VERTEX;
  uVar12 = CONCAT71((int7)(uVar12 >> 8),1);
  local_a0 = node;
LAB_00ff341e:
  pTVar10 = local_a0;
  pSVar6 = (ShaderPerformanceCaseGroup *)operator_new(0x80);
  pcVar15 = "Vertex and fragment";
  if ((uVar12 & 1) != 0) {
    pcVar15 = "Unexpected vertex";
  }
  deqp::gls::ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup
            (pSVar6,pTVar5->m_testCtx,pcVar15 + 0xb,::glcts::fixed_sample_locations_values + 1);
  tcu::TestNode::addChild(pTVar10,(TestNode *)pSVar6);
  local_c0 = (ShaderPerformanceCaseGroup *)0x1c51a3c;
  if ((uVar12 & 1) != 0) {
    local_c0 = (ShaderPerformanceCaseGroup *)0x1b7f83b;
  }
  iVar13 = 0;
  do {
    pcVar15 = "static";
    if (iVar13 != 0) {
      if (iVar13 != 1) break;
      pcVar15 = "uniform";
    }
    pSVar8 = (ShaderPerformanceCase *)operator_new(0x1f0);
    LVar1 = local_b8->type;
    deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
              (pSVar8,((Context *)pTVar5[1]._vptr_TestNode)->m_testCtx,
               ((Context *)pTVar5[1]._vptr_TestNode)->m_renderCtx,pcVar15,
               ::glcts::fixed_sample_locations_values + 1,caseType);
    (pSVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__LoopCase_02134690;
    *(int *)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode = iVar13;
    *(LoopType *)((long)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = LVar1;
    *(undefined1 *)&pSVar8[1].super_TestCase.super_TestNode.m_testCtx = 1;
    pSVar8[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    pSVar8[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
    *(undefined8 *)((long)&pSVar8[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) = 0;
    *(undefined8 *)((long)&pSVar8[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0;
    deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar6,pSVar8);
    iVar13 = iVar13 + 1;
    pTVar5 = local_b0;
  } while( true );
  local_98 = (char *)CONCAT44(local_98._4_4_,(int)uVar12);
  pSVar8 = (ShaderPerformanceCase *)operator_new(0x1f0);
  pCVar4 = (Context *)pTVar5[1]._vptr_TestNode;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,(char *)local_c0,(allocator<char> *)&local_70);
  local_100 = &local_f0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_f0 = *plVar9;
    lStack_e8 = plVar7[3];
  }
  else {
    local_f0 = *plVar9;
    local_100 = (long *)*plVar7;
  }
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  LVar1 = local_b8->type;
  deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
            (pSVar8,pCVar4->m_testCtx,pCVar4->m_renderCtx,(char *)local_100,
             ::glcts::fixed_sample_locations_values + 1,caseType);
  (pSVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__LoopCase_02134690;
  *(undefined4 *)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode = 2;
  *(LoopType *)((long)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = LVar1;
  *(undefined1 *)&pSVar8[1].super_TestCase.super_TestNode.m_testCtx = 1;
  pSVar8[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pSVar8[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  *(undefined8 *)((long)&pSVar8[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pSVar8[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0;
  deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar6,pSVar8);
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  pSVar8 = (ShaderPerformanceCase *)operator_new(0x1f0);
  pCVar4 = (Context *)pTVar5[1]._vptr_TestNode;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,(char *)local_c0,(allocator<char> *)&local_70);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_100 = &local_f0;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_f0 = *plVar9;
    lStack_e8 = plVar7[3];
  }
  else {
    local_f0 = *plVar9;
    local_100 = (long *)*plVar7;
  }
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
            (pSVar8,pCVar4->m_testCtx,pCVar4->m_renderCtx,(char *)local_100,
             ::glcts::fixed_sample_locations_values + 1,caseType);
  (pSVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__LoopCase_02134690;
  *(undefined4 *)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode = 2;
  *(LoopType *)((long)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = LVar1;
  *(undefined1 *)&pSVar8[1].super_TestCase.super_TestNode.m_testCtx = 0;
  pSVar8[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pSVar8[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  *(undefined8 *)((long)&pSVar8[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pSVar8[1].super_TestCase.super_TestNode.m_name.field_2 + 4) = 0;
  deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar6,pSVar8);
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  pcVar15 = local_98;
  uVar12 = (ulong)local_98 & 0xffffffff;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  pSVar8 = (ShaderPerformanceCase *)operator_new(0x1c8);
  pTVar2 = ((Context *)pTVar5[1]._vptr_TestNode)->m_testCtx;
  pRVar3 = ((Context *)pTVar5[1]._vptr_TestNode)->m_renderCtx;
  if (((ulong)pcVar15 & 1) == 0) goto LAB_00ff37dd;
  deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
            (pSVar8,pTVar2,pRVar3,"reference",::glcts::fixed_sample_locations_values + 1,
             CASETYPE_VERTEX);
  (pSVar8->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPerformanceCase_02134800;
  *(undefined1 *)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
  deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar6,pSVar8);
  caseType = CASETYPE_FRAGMENT;
  uVar12 = 0;
  goto LAB_00ff341e;
LAB_00ff37dd:
  deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
            (pSVar8,pTVar2,pRVar3,"reference_stable",::glcts::fixed_sample_locations_values + 1,
             CASETYPE_FRAGMENT);
  (pSVar8->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPerformanceCase_02134800;
  *(undefined1 *)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
  deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar6,pSVar8);
  pSVar8 = (ShaderPerformanceCase *)operator_new(0x1c8);
  deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
            (pSVar8,((Context *)pTVar5[1]._vptr_TestNode)->m_testCtx,
             ((Context *)pTVar5[1]._vptr_TestNode)->m_renderCtx,"reference_unstable",
             ::glcts::fixed_sample_locations_values + 1,CASETYPE_FRAGMENT);
  (pSVar8->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPerformanceCase_02134800;
  *(undefined1 *)&pSVar8[1].super_TestCase.super_TestNode._vptr_TestNode = 0;
  deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar6,pSVar8);
  pTVar10 = (TestNode *)((long)&local_a8->_vptr_TestNode + 1);
  if (pTVar10 == (TestNode *)0x3) {
    return extraout_EAX;
  }
  goto LAB_00ff33cd;
}

Assistant:

void ShaderControlStatementTests::init (void)
{
	// Conditional cases (if-else).

	tcu::TestCaseGroup* ifElseGroup = new tcu::TestCaseGroup(m_testCtx, "if_else", "if-else Conditional Performance Tests");
	addChild(ifElseGroup);

	for (int isFrag = 0; isFrag <= 1; isFrag++)
	{
		bool isVertex = isFrag == 0;
		ShaderPerformanceCaseGroup* vertexOrFragmentGroup = new ShaderPerformanceCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
		ifElseGroup->addChild(vertexOrFragmentGroup);

		DE_STATIC_ASSERT(DECISION_STATIC == 0);
		for (int decisionType = (int)DECISION_STATIC; decisionType < (int)DECISION_LAST; decisionType++)
		{
			const char* decisionName = decisionType == (int)DECISION_STATIC		? "static" :
										decisionType == (int)DECISION_UNIFORM	? "uniform" :
										decisionType == (int)DECISION_ATTRIBUTE	? (isVertex ? "attribute" : "varying") :
																					DE_NULL;
			DE_ASSERT(decisionName != DE_NULL);

			for (int workloadDivision = 0; workloadDivision < ConditionalCase::WORKLOAD_DIVISION_LAST; workloadDivision++)
			{
				const char* workloadDivisionSuffix = workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_EVEN			? "" :
													 workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_TRUE_HEAVY		? "_with_heavier_true" :
													 workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_FALSE_HEAVY	? "_with_heavier_false" :
																																  DE_NULL;
				DE_ASSERT(workloadDivisionSuffix != DE_NULL);

				DE_STATIC_ASSERT(ConditionalCase::BRANCH_TRUE == 0);
				for (int branchResult = (int)ConditionalCase::BRANCH_TRUE; branchResult < (int)ConditionalCase::BRANCH_LAST; branchResult++)
				{
					if (decisionType != (int)DECISION_ATTRIBUTE && branchResult == (int)ConditionalCase::BRANCH_MIXED)
						continue;

					const char* branchResultName = branchResult == (int)ConditionalCase::BRANCH_TRUE	? "true" :
												   branchResult == (int)ConditionalCase::BRANCH_FALSE	? "false" :
												   branchResult == (int)ConditionalCase::BRANCH_MIXED	? "mixed" :
																										  DE_NULL;
					DE_ASSERT(branchResultName != DE_NULL);

					string caseName = string("") + decisionName + "_" + branchResultName + workloadDivisionSuffix;

					vertexOrFragmentGroup->addChild(new ConditionalCase(m_context, caseName.c_str(), "",
																		(DecisionType)decisionType, (ConditionalCase::BranchResult)branchResult,
																		(ConditionalCase::WorkloadDivision)workloadDivision, isVertex));
				}
			}
		}

		if (isVertex)
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference", "", true, isVertex));
		else
		{
			// Only fragment case with BRANCH_MIXED has an additional fract() call.
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference_unmixed", "", true, isVertex));
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference_mixed", "", false, isVertex));
		}

		vertexOrFragmentGroup->addChild(new EmptyWorkloadReferenceCase(m_context, "reference_empty", "", isVertex));
	}

	// Loop cases.

	static const struct
	{
		LoopCase::LoopType	type;
		const char*			name;
		const char*			description;
	} loopGroups[] =
	{
		{LoopCase::LOOP_FOR,		"for",		"for Loop Performance Tests"},
		{LoopCase::LOOP_WHILE,		"while",	"while Loop Performance Tests"},
		{LoopCase::LOOP_DO_WHILE,	"do_while",	"do-while Loop Performance Tests"}
	};

	for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(loopGroups); groupNdx++)
	{
		tcu::TestCaseGroup* currentLoopGroup = new tcu::TestCaseGroup(m_testCtx, loopGroups[groupNdx].name, loopGroups[groupNdx].description);
		addChild(currentLoopGroup);

		for (int isFrag = 0; isFrag <= 1; isFrag++)
		{
			bool isVertex = isFrag == 0;
			ShaderPerformanceCaseGroup* vertexOrFragmentGroup = new ShaderPerformanceCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
			currentLoopGroup->addChild(vertexOrFragmentGroup);

			DE_STATIC_ASSERT(DECISION_STATIC == 0);
			for (int decisionType = (int)DECISION_STATIC; decisionType < (int)DECISION_LAST; decisionType++)
			{
				const char* decisionName = decisionType == (int)DECISION_STATIC		? "static" :
										   decisionType == (int)DECISION_UNIFORM	? "uniform" :
										   decisionType == (int)DECISION_ATTRIBUTE	? (isVertex ? "attribute" : "varying") :
																					  DE_NULL;
				DE_ASSERT(decisionName != DE_NULL);

				if (decisionType == (int)DECISION_ATTRIBUTE)
				{
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, (string(decisionName) + "_stable").c_str(), "", loopGroups[groupNdx].type, (DecisionType)decisionType, true, isVertex));
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, (string(decisionName) + "_unstable").c_str(), "", loopGroups[groupNdx].type, (DecisionType)decisionType, false, isVertex));
				}
				else
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, decisionName, "", loopGroups[groupNdx].type, (DecisionType)decisionType, true, isVertex));

			}

			if (isVertex)
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference", "", true, isVertex));
			else
			{
				// Only fragment case with unstable attribute has an additional fract() call.
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference_stable", "", true, isVertex));
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference_unstable", "", false, isVertex));
			}
		}
	}
}